

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O3

void base_shift_right(cpu_registers *registers,uint8_t *value_to_shift)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = *value_to_shift;
  registers->flags = registers->flags & 0xfe | bVar1 & 1;
  *value_to_shift = bVar1 >> 1;
  bVar2 = registers->flags;
  bVar1 = (bVar1 < 2) * '\x02';
  registers->flags = bVar1 | bVar2 & 0xfd;
  registers->flags = *value_to_shift & 0x80 | bVar1 | bVar2 & 0x7d;
  return;
}

Assistant:

void base_shift_right(cpu_registers* registers, uint8_t* value_to_shift) {
    const uint16_t carry_bit_position = 0x1;
    uint8_t result = *value_to_shift >> 1;

    if(*value_to_shift & carry_bit_position) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);
    *value_to_shift = result;
    determine_zero_flag(registers, *value_to_shift);
    determine_negative_flag(registers, *value_to_shift);
}